

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O1

string * __thiscall
cmFindLibraryCommand::FindFrameworkLibraryDirsPerName_abi_cxx11_
          (string *__return_storage_ptr__,cmFindLibraryCommand *this)

{
  bool bVar1;
  pointer pbVar2;
  pointer pbVar3;
  string fwPath;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pbVar2 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar2 != (this->super_cmFindBase).Names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      for (pbVar3 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar3 != (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
        std::__cxx11::string::_M_assign((string *)&local_50);
        std::__cxx11::string::_M_append((char *)&local_50,(ulong)(pbVar2->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_50);
        bVar1 = cmsys::SystemTools::FileIsDirectory(&local_50);
        if (bVar1) {
          cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,&local_50);
          goto LAB_00294475;
        }
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != (this->super_cmFindBase).Names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_00294475:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindLibraryCommand::FindFrameworkLibraryDirsPerName()
{
  std::string fwPath;
  // Search for each name in all search paths.
  for(std::vector<std::string>::const_iterator ni = this->Names.begin();
      ni != this->Names.end() ; ++ni)
    {
    for(std::vector<std::string>::const_iterator
          di = this->SearchPaths.begin();
        di != this->SearchPaths.end(); ++di)
      {
      fwPath = *di;
      fwPath += *ni;
      fwPath += ".framework";
      if(cmSystemTools::FileIsDirectory(fwPath))
        {
        return cmSystemTools::CollapseFullPath(fwPath);
        }
      }
    }

  // No framework found.
  return "";
}